

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O0

void __thiscall Reader::processboundssec(Reader *this)

{
  LpSectionKeyword LVar1;
  char *pcVar2;
  anon_union_8_5_ebd6940d_for_ProcessedToken_1 aVar3;
  bool bVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
  *p_Var7;
  pointer pPVar8;
  element_type *peVar9;
  LpComparisonType dir_1;
  shared_ptr<Variable> var_3;
  string name_3;
  double value_1;
  LpComparisonType dir;
  shared_ptr<Variable> var_2;
  string name_2;
  double value;
  shared_ptr<Variable> var_1;
  string name_1;
  double ub;
  double lb;
  iterator next4;
  iterator next3;
  iterator next2;
  shared_ptr<Variable> var;
  string name;
  iterator next1;
  iterator *end;
  iterator *begin;
  anon_union_8_5_ebd6940d_for_ProcessedToken_1 in_stack_fffffffffffffdf8;
  anon_union_8_5_ebd6940d_for_ProcessedToken_1 aVar10;
  anon_union_8_5_ebd6940d_for_ProcessedToken_1 in_stack_fffffffffffffe00;
  key_type *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  key_type *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  allocator local_151;
  string *in_stack_fffffffffffffeb0;
  Builder *in_stack_fffffffffffffeb8;
  allocator local_109;
  string local_108 [32];
  anon_union_8_5_ebd6940d_for_ProcessedToken_1 local_e8;
  allocator local_c9;
  string local_c8 [32];
  anon_union_8_5_ebd6940d_for_ProcessedToken_1 local_a8;
  anon_union_8_5_ebd6940d_for_ProcessedToken_1 local_a0;
  __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
  local_98;
  __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
  local_90;
  __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
  local_88 [5];
  allocator local_59;
  string local_58 [32];
  __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
  local_38;
  undefined4 local_2c;
  __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
  *local_28;
  undefined4 local_1c;
  mapped_type *local_18;
  undefined4 local_c;
  
  local_c = 4;
  sVar5 = std::
          map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
          ::count((map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                  in_stack_fffffffffffffe08);
  if (sVar5 != 0) {
    local_1c = 4;
    local_18 = std::
               map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
               ::operator[]((map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                            in_stack_fffffffffffffe38);
    local_2c = 4;
    pmVar6 = std::
             map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
             ::operator[]((map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
                           *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                          in_stack_fffffffffffffe38);
    local_28 = &pmVar6->second;
    while (bVar4 = __gnu_cxx::operator!=
                             ((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                               *)in_stack_fffffffffffffe00.name,
                              (__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                               *)in_stack_fffffffffffffdf8.name), bVar4) {
      local_38._M_current = (local_18->first)._M_current;
      __gnu_cxx::
      __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
      ::operator++(&local_38);
      bVar4 = __gnu_cxx::operator!=
                        ((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                          *)in_stack_fffffffffffffe00.name,
                         (__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                          *)in_stack_fffffffffffffdf8.name);
      if (((bVar4) &&
          (pPVar8 = __gnu_cxx::
                    __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                    ::operator->(&local_18->first), pPVar8->type == VARID)) &&
         (pPVar8 = __gnu_cxx::
                   __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                   ::operator->(&local_38), pPVar8->type == FREE)) {
        pPVar8 = __gnu_cxx::
                 __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                 ::operator->(&local_18->first);
        pcVar2 = (pPVar8->field_1).name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_58,pcVar2,&local_59);
        std::allocator<char>::~allocator((allocator<char> *)&local_59);
        Builder::getvarbyname(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
        peVar9 = std::__shared_ptr_access<Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x41f199);
        peVar9->lowerbound = -INFINITY;
        peVar9 = std::__shared_ptr_access<Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x41f1b3);
        peVar9->upperbound = INFINITY;
        p_Var7 = __gnu_cxx::
                 __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                 ::operator++(&local_38);
        (local_18->first)._M_current = p_Var7->_M_current;
        std::shared_ptr<Variable>::~shared_ptr((shared_ptr<Variable> *)0x41f1eb);
        std::__cxx11::string::~string(local_58);
      }
      else {
        local_88[0]._M_current = local_38._M_current;
        local_90._M_current = local_38._M_current;
        local_98._M_current = local_38._M_current;
        bVar4 = __gnu_cxx::operator!=
                          ((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                            *)in_stack_fffffffffffffe00.name,
                           (__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                            *)in_stack_fffffffffffffdf8.name);
        if (bVar4) {
          __gnu_cxx::
          __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
          ::operator++(local_88);
          __gnu_cxx::
          __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
          ::operator++(&local_90);
          __gnu_cxx::
          __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
          ::operator++(&local_98);
        }
        bVar4 = __gnu_cxx::operator!=
                          ((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                            *)in_stack_fffffffffffffe00.name,
                           (__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                            *)in_stack_fffffffffffffdf8.name);
        if (bVar4) {
          __gnu_cxx::
          __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
          ::operator++(&local_90);
          __gnu_cxx::
          __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
          ::operator++(&local_98);
        }
        bVar4 = __gnu_cxx::operator!=
                          ((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                            *)in_stack_fffffffffffffe00.name,
                           (__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                            *)in_stack_fffffffffffffdf8.name);
        if (bVar4) {
          __gnu_cxx::
          __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
          ::operator++(&local_98);
        }
        bVar4 = __gnu_cxx::operator!=
                          ((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                            *)in_stack_fffffffffffffe00.name,
                           (__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                            *)in_stack_fffffffffffffdf8.name);
        if ((((bVar4) &&
             (pPVar8 = __gnu_cxx::
                       __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                       ::operator->(&local_18->first), pPVar8->type == CONST)) &&
            ((pPVar8 = __gnu_cxx::
                       __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                       ::operator->(&local_38), pPVar8->type == COMP &&
             ((pPVar8 = __gnu_cxx::
                        __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                        ::operator->(local_88), pPVar8->type == VARID &&
              (pPVar8 = __gnu_cxx::
                        __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                        ::operator->(&local_90), pPVar8->type == COMP)))))) &&
           (pPVar8 = __gnu_cxx::
                     __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                     ::operator->(&local_98), pPVar8->type == CONST)) {
          __gnu_cxx::
          __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
          ::operator->(&local_38);
          lpassert(SUB41((uint)in_stack_fffffffffffffe14 >> 0x18,0));
          __gnu_cxx::
          __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
          ::operator->(&local_90);
          lpassert(SUB41((uint)in_stack_fffffffffffffe14 >> 0x18,0));
          pPVar8 = __gnu_cxx::
                   __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                   ::operator->(&local_18->first);
          local_a0 = pPVar8->field_1;
          pPVar8 = __gnu_cxx::
                   __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                   ::operator->(&local_98);
          local_a8 = pPVar8->field_1;
          pPVar8 = __gnu_cxx::
                   __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                   ::operator->(local_88);
          pcVar2 = (pPVar8->field_1).name;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_c8,pcVar2,&local_c9);
          std::allocator<char>::~allocator((allocator<char> *)&local_c9);
          Builder::getvarbyname(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
          aVar3 = local_a0;
          peVar9 = std::__shared_ptr_access<Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x41f4a4);
          aVar10 = local_a8;
          peVar9->lowerbound = (double)aVar3;
          peVar9 = std::__shared_ptr_access<Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x41f4cb);
          peVar9->upperbound = (double)aVar10;
          p_Var7 = __gnu_cxx::
                   __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                   ::operator++(&local_98);
          (local_18->first)._M_current = p_Var7->_M_current;
          std::shared_ptr<Variable>::~shared_ptr((shared_ptr<Variable> *)0x41f501);
          std::__cxx11::string::~string(local_c8);
        }
        else {
          bVar4 = __gnu_cxx::operator!=
                            ((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                              *)in_stack_fffffffffffffe00.name,
                             (__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                              *)in_stack_fffffffffffffdf8.name);
          if ((((bVar4) &&
               (pPVar8 = __gnu_cxx::
                         __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                         ::operator->(&local_18->first), pPVar8->type == CONST)) &&
              (pPVar8 = __gnu_cxx::
                        __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                        ::operator->(&local_38), pPVar8->type == COMP)) &&
             (pPVar8 = __gnu_cxx::
                       __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                       ::operator->(local_88), pPVar8->type == VARID)) {
            pPVar8 = __gnu_cxx::
                     __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                     ::operator->(&local_18->first);
            local_e8 = pPVar8->field_1;
            pPVar8 = __gnu_cxx::
                     __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                     ::operator->(local_88);
            pcVar2 = (pPVar8->field_1).name;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_108,pcVar2,&local_109);
            std::allocator<char>::~allocator((allocator<char> *)&local_109);
            Builder::getvarbyname(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
            pPVar8 = __gnu_cxx::
                     __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                     ::operator->(&local_38);
            LVar1 = (pPVar8->field_1).keyword;
            lpassert(SUB41((uint)in_stack_fffffffffffffe14 >> 0x18,0));
            aVar10 = local_e8;
            if (LVar1 == NONE) {
              peVar9 = std::__shared_ptr_access<Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x41f74c);
              peVar9->lowerbound = (double)aVar10;
            }
            else if (LVar1 == OBJMAX) {
              peVar9 = std::__shared_ptr_access<Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x41f79e);
              peVar9->upperbound = (double)aVar10;
              peVar9 = std::__shared_ptr_access<Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x41f7b6);
              peVar9->lowerbound = (double)aVar10;
            }
            else if (LVar1 == BOUNDS) {
              peVar9 = std::__shared_ptr_access<Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x41f775);
              peVar9->upperbound = (double)aVar10;
            }
            else {
              lpassert(SUB41((uint)in_stack_fffffffffffffe14 >> 0x18,0));
            }
            (local_18->first)._M_current = local_90._M_current;
            std::shared_ptr<Variable>::~shared_ptr((shared_ptr<Variable> *)0x41f7ee);
            std::__cxx11::string::~string(local_108);
          }
          else {
            bVar4 = __gnu_cxx::operator!=
                              ((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                                *)in_stack_fffffffffffffe00.name,
                               (__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                                *)in_stack_fffffffffffffdf8.name);
            if (((bVar4) &&
                (pPVar8 = __gnu_cxx::
                          __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                          ::operator->(&local_18->first), pPVar8->type == VARID)) &&
               ((pPVar8 = __gnu_cxx::
                          __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                          ::operator->(&local_38), pPVar8->type == COMP &&
                (pPVar8 = __gnu_cxx::
                          __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                          ::operator->(local_88), pPVar8->type == CONST)))) {
              pPVar8 = __gnu_cxx::
                       __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                       ::operator->(local_88);
              aVar10 = pPVar8->field_1;
              pPVar8 = __gnu_cxx::
                       __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                       ::operator->(&local_18->first);
              pcVar2 = (pPVar8->field_1).name;
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&stack0xfffffffffffffeb0,pcVar2,&local_151);
              std::allocator<char>::~allocator((allocator<char> *)&local_151);
              Builder::getvarbyname(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
              pPVar8 = __gnu_cxx::
                       __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                       ::operator->(&local_38);
              LVar1 = (pPVar8->field_1).keyword;
              in_stack_fffffffffffffe14 = 0;
              if (LVar1 != OBJMIN) {
                in_stack_fffffffffffffe14 = (uint)(LVar1 != CON) << 0x18;
              }
              lpassert(SUB41((uint)in_stack_fffffffffffffe14 >> 0x18,0));
              if (LVar1 == NONE) {
                peVar9 = std::
                         __shared_ptr_access<Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                         operator->((__shared_ptr_access<Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x41f9ff);
                peVar9->upperbound = (double)aVar10;
              }
              else if (LVar1 == OBJMAX) {
                peVar9 = std::
                         __shared_ptr_access<Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                         operator->((__shared_ptr_access<Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x41fa50);
                peVar9->upperbound = (double)aVar10;
                peVar9 = std::
                         __shared_ptr_access<Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                         operator->((__shared_ptr_access<Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x41fa67);
                peVar9->lowerbound = (double)aVar10;
                in_stack_fffffffffffffdf8 = aVar10;
              }
              else if (LVar1 == BOUNDS) {
                peVar9 = std::
                         __shared_ptr_access<Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                         operator->((__shared_ptr_access<Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x41fa28);
                peVar9->lowerbound = (double)aVar10;
                in_stack_fffffffffffffe00 = aVar10;
              }
              else {
                lpassert(SUB41((uint)in_stack_fffffffffffffe14 >> 0x18,0));
              }
              (local_18->first)._M_current = local_90._M_current;
              std::shared_ptr<Variable>::~shared_ptr((shared_ptr<Variable> *)0x41fa9e);
              std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb0);
            }
            else {
              lpassert(SUB41((uint)in_stack_fffffffffffffe14 >> 0x18,0));
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Reader::processboundssec() {
  if (!sectiontokens.count(LpSectionKeyword::BOUNDS)) return;
  std::vector<ProcessedToken>::iterator& begin(
      sectiontokens[LpSectionKeyword::BOUNDS].first);
  std::vector<ProcessedToken>::iterator& end(
      sectiontokens[LpSectionKeyword::BOUNDS].second);
  while (begin != end) {
    std::vector<ProcessedToken>::iterator next1 = begin;  // token after begin
    ++next1;

    // VAR free
    if (next1 != end && begin->type == ProcessedTokenType::VARID &&
        next1->type == ProcessedTokenType::FREE) {
      std::string name = begin->name;
      std::shared_ptr<Variable> var = builder.getvarbyname(name);
      var->lowerbound = -kHighsInf;
      var->upperbound = kHighsInf;
      begin = ++next1;
      continue;
    }

    std::vector<ProcessedToken>::iterator next2 =
        next1;  // token 2nd-after begin
    std::vector<ProcessedToken>::iterator next3 =
        next1;  // token 3rd-after begin
    std::vector<ProcessedToken>::iterator next4 =
        next1;  // token 4th-after begin
    if (next1 != end) {
      ++next2;
      ++next3;
      ++next4;
    }
    if (next2 != end) {
      ++next3;
      ++next4;
    }
    if (next3 != end) ++next4;

    // CONST COMP VAR COMP CONST
    if (next4 != end && begin->type == ProcessedTokenType::CONST &&
        next1->type == ProcessedTokenType::COMP &&
        next2->type == ProcessedTokenType::VARID &&
        next3->type == ProcessedTokenType::COMP &&
        next4->type == ProcessedTokenType::CONST) {
      lpassert(next1->dir == LpComparisonType::LEQ);
      lpassert(next3->dir == LpComparisonType::LEQ);

      double lb = begin->value;
      double ub = next4->value;

      std::string name = next2->name;
      std::shared_ptr<Variable> var = builder.getvarbyname(name);

      var->lowerbound = lb;
      var->upperbound = ub;

      begin = ++next4;
      continue;
    }

    // CONST COMP VAR
    if (next2 != end && begin->type == ProcessedTokenType::CONST &&
        next1->type == ProcessedTokenType::COMP &&
        next2->type == ProcessedTokenType::VARID) {
      double value = begin->value;
      std::string name = next2->name;
      std::shared_ptr<Variable> var = builder.getvarbyname(name);
      LpComparisonType dir = next1->dir;

      lpassert(dir != LpComparisonType::L && dir != LpComparisonType::G);

      switch (dir) {
        case LpComparisonType::LEQ:
          var->lowerbound = value;
          break;
        case LpComparisonType::GEQ:
          var->upperbound = value;
          break;
        case LpComparisonType::EQ:
          var->lowerbound = var->upperbound = value;
          break;
        default:
          lpassert(false);
      }
      begin = next3;
      continue;
    }

    // VAR COMP CONST
    if (next2 != end && begin->type == ProcessedTokenType::VARID &&
        next1->type == ProcessedTokenType::COMP &&
        next2->type == ProcessedTokenType::CONST) {
      double value = next2->value;
      std::string name = begin->name;
      std::shared_ptr<Variable> var = builder.getvarbyname(name);
      LpComparisonType dir = next1->dir;

      lpassert(dir != LpComparisonType::L && dir != LpComparisonType::G);

      switch (dir) {
        case LpComparisonType::LEQ:
          var->upperbound = value;
          break;
        case LpComparisonType::GEQ:
          var->lowerbound = value;
          break;
        case LpComparisonType::EQ:
          var->lowerbound = var->upperbound = value;
          break;
        default:
          lpassert(false);
      }
      begin = next3;
      continue;
    }

    lpassert(false);
  }
}